

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<short>::test_many<(libdivide::Branching)1>(DivideTest<short> *this,short denom)

{
  short sVar1;
  ushort uVar2;
  short sVar3;
  short extraout_AX;
  DivideTest<short> *unaff_RBX;
  long lVar4;
  divider<short,_(libdivide::Branching)1> the_divider;
  divider<short,_(libdivide::Branching)1> local_4c;
  string_class local_48;
  
  if (denom == 0) {
    test_many<(libdivide::Branching)1>();
    sVar3 = extraout_AX;
  }
  else {
    uVar2 = -denom;
    if (0 < denom) {
      uVar2 = denom;
    }
    local_4c.div.denom.more = (uint8_t)(LZCOUNT(uVar2) ^ 0xfU);
    if ((uVar2 - 1 & uVar2) == 0) {
      local_4c.div.denom.more = local_4c.div.denom.more | (byte)((ushort)denom >> 8) & 0x80;
      local_4c.div.denom.magic = 0;
    }
    else {
      sVar1 = (short)((uint)(0x8000 << (LZCOUNT(uVar2) ^ 0xfU)) / (uint)uVar2);
      sVar3 = uVar2 * sVar1;
      local_4c.div.denom.more = ((-1 < denom) << 7 | local_4c.div.denom.more) - 0x40;
      local_4c.div.denom.magic = (0 < sVar3 || uVar2 <= (ushort)(sVar3 * -2)) + 1 + sVar1 * 2;
    }
    sVar3 = libdivide::divider<short,_(libdivide::Branching)1>::recover(&local_4c);
    unaff_RBX = this;
    if (sVar3 == denom) {
      lVar4 = 0;
      do {
        test_one<(libdivide::Branching)1>(this,*(short *)((long)edgeCases + lVar4),denom,&local_4c);
        lVar4 = lVar4 + 2;
      } while (lVar4 != 0xb8);
      test_small_numerators<(libdivide::Branching)1>(this,denom,&local_4c);
      test_pow2_numerators<(libdivide::Branching)1>(this,denom,&local_4c);
      sVar3 = -1;
      do {
        test_one<(libdivide::Branching)1>(this,sVar3,denom,&local_4c);
        sVar3 = sVar3 * 2;
      } while (sVar3 != 0);
      test_random_numerators<(libdivide::Branching)1>(this,denom,&local_4c);
      test_vectordivide_numerators<(libdivide::Branching)1>(this,denom,&local_4c);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Failed to recover divisor for ",0x1e);
  testcase_name_abi_cxx11_(&local_48,unaff_RBX,1);
  std::operator<<((ostream *)&std::cerr,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<((ostream *)&std::cerr,": ");
  std::ostream::operator<<((ostream *)&std::cerr,denom);
  std::operator<<((ostream *)&std::cerr,", but got ");
  std::ostream::operator<<((ostream *)&std::cerr,sVar3);
  std::operator<<((ostream *)&std::cerr,"\n");
  exit(1);
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }